

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS
ref_recon_kexact_with_aux
          (REF_GLOB center_global,REF_CLOUD ref_cloud,REF_BOOL twod,REF_DBL *gradient,
          REF_DBL *hessian)

{
  long lVar1;
  REF_GLOB local_438;
  REF_GLOB local_430;
  REF_GLOB local_428;
  REF_GLOB local_420;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_raise;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL verbose;
  REF_DBL xyzs [4];
  int local_3b0;
  int local_3ac;
  REF_INT j;
  REF_INT i;
  REF_INT im;
  REF_INT item;
  REF_GLOB cloud_global;
  REF_INT n;
  REF_INT m;
  REF_DBL *r;
  REF_DBL *q;
  REF_DBL *a;
  REF_DBL dq;
  REF_DBL dz;
  REF_DBL dy;
  REF_DBL dx;
  REF_DBL ab [90];
  REF_DBL geom [9];
  REF_DBL *hessian_local;
  REF_DBL *gradient_local;
  REF_BOOL twod_local;
  REF_CLOUD ref_cloud_local;
  REF_GLOB center_global_local;
  
  for (j = 0; j < 6; j = j + 1) {
    hessian[j] = 0.0;
  }
  for (j = 0; j < 3; j = j + 1) {
    gradient[j] = 0.0;
  }
  center_global_local._4_4_ = ref_cloud_item(ref_cloud,center_global,&i);
  if (center_global_local._4_4_ == 0) {
    for (local_3ac = 0; local_3ac < ref_cloud->naux; local_3ac = local_3ac + 1) {
      *(REF_DBL *)(&ref_private_macro_code_rss + (long)local_3ac * 2) =
           ref_cloud->aux[local_3ac + ref_cloud->naux * i];
    }
    cloud_global._4_4_ = ref_cloud->n + -1;
    if (twod != 0) {
      cloud_global._4_4_ = ref_cloud->n + 3;
    }
    cloud_global._0_4_ = 9;
    if (cloud_global._4_4_ < 9) {
      center_global_local._4_4_ = 4;
    }
    else if (cloud_global._4_4_ * 9 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x1cb
             ,"ref_recon_kexact_with_aux","malloc a of REF_DBL negative");
      center_global_local._4_4_ = 1;
    }
    else {
      q = (REF_DBL *)malloc((long)(cloud_global._4_4_ * 9) << 3);
      if (q == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x1cb,"ref_recon_kexact_with_aux","malloc a of REF_DBL NULL");
        center_global_local._4_4_ = 2;
      }
      else if (cloud_global._4_4_ * (int)cloud_global < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x1cc,"ref_recon_kexact_with_aux","malloc q of REF_DBL negative");
        center_global_local._4_4_ = 1;
      }
      else {
        r = (REF_DBL *)malloc((long)(cloud_global._4_4_ * (int)cloud_global) << 3);
        if (r == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x1cc,"ref_recon_kexact_with_aux","malloc q of REF_DBL NULL");
          center_global_local._4_4_ = 2;
        }
        else if ((int)cloud_global * (int)cloud_global < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x1cd,"ref_recon_kexact_with_aux","malloc r of REF_DBL negative");
          center_global_local._4_4_ = 1;
        }
        else {
          _n = (REF_DBL *)malloc((long)((int)cloud_global * (int)cloud_global) << 3);
          if (_n == (REF_DBL *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x1cd,"ref_recon_kexact_with_aux","malloc r of REF_DBL NULL");
            center_global_local._4_4_ = 2;
          }
          else {
            local_3ac = 0;
            if (twod != 0) {
              ab[0x59] = 0.0;
              for (local_3b0 = 0; local_3b0 < (int)cloud_global; local_3b0 = local_3b0 + 1) {
                q[cloud_global._4_4_ * local_3b0] = ab[(long)local_3b0 + 0x59];
              }
              ab[0x59] = 0.0;
              for (local_3b0 = 0; local_3b0 < (int)cloud_global; local_3b0 = local_3b0 + 1) {
                q[cloud_global._4_4_ * local_3b0 + 1] = ab[(long)local_3b0 + 0x59];
              }
              ab[0x59] = 0.5;
              for (local_3b0 = 0; local_3b0 < (int)cloud_global; local_3b0 = local_3b0 + 1) {
                q[cloud_global._4_4_ * local_3b0 + 2] = ab[(long)local_3b0 + 0x59];
              }
              dy = 0.0;
              dz = 1.0;
              dq = 1.0;
              ab[0x59] = 0.0;
              for (local_3b0 = 0; local_3b0 < (int)cloud_global; local_3b0 = local_3b0 + 1) {
                q[cloud_global._4_4_ * local_3b0 + 3] = ab[(long)local_3b0 + 0x59];
              }
              local_3ac = 4;
            }
            i = 0;
            if (ref_cloud->n < 1) {
              local_420 = -1;
            }
            else {
              local_420 = *ref_cloud->global;
            }
            _im = local_420;
            while (i < ref_cloud->n) {
              if (center_global != _im) {
                dy = ref_cloud->aux[ref_cloud->naux * i] - _ref_private_macro_code_rss;
                dz = ref_cloud->aux[ref_cloud->naux * i + 1] - xyzs[0];
                dq = ref_cloud->aux[ref_cloud->naux * i + 2] - xyzs[1];
                ab[0x59] = dy * 0.5 * dy;
                for (local_3b0 = 0; local_3b0 < (int)cloud_global; local_3b0 = local_3b0 + 1) {
                  q[local_3ac + cloud_global._4_4_ * local_3b0] = ab[(long)local_3b0 + 0x59];
                }
                local_3ac = local_3ac + 1;
              }
              i = i + 1;
              if ((i < 0) || (ref_cloud->n <= i)) {
                local_428 = -1;
              }
              else {
                local_428 = ref_cloud->global[i];
              }
              _im = local_428;
            }
            if ((long)cloud_global._4_4_ == (long)local_3ac) {
              center_global_local._4_4_ = ref_matrix_qr(cloud_global._4_4_,(int)cloud_global,q,r,_n)
              ;
              if (center_global_local._4_4_ == 0) {
                for (local_3ac = 0; local_3ac < 0x5a; local_3ac = local_3ac + 1) {
                  ab[(long)local_3ac + -1] = 0.0;
                }
                for (local_3ac = 0; local_3ac < 9; local_3ac = local_3ac + 1) {
                  for (local_3b0 = 0; local_3b0 < 9; local_3b0 = local_3b0 + 1) {
                    lVar1 = (long)(local_3ac + local_3b0 * 9);
                    ab[lVar1 + -1] = _n[local_3ac + local_3b0 * 9] + ab[lVar1 + -1];
                  }
                }
                local_3ac = 0;
                if (twod != 0) {
                  for (local_3b0 = 0; local_3b0 < 9; local_3b0 = local_3b0 + 1) {
                    ab[(long)(local_3b0 + 0x51) + -1] =
                         r[cloud_global._4_4_ * local_3b0] * 0.0 + ab[(long)(local_3b0 + 0x51) + -1]
                    ;
                  }
                  for (local_3b0 = 0; local_3b0 < 9; local_3b0 = local_3b0 + 1) {
                    ab[(long)(local_3b0 + 0x51) + -1] =
                         r[cloud_global._4_4_ * local_3b0 + 1] * 0.0 +
                         ab[(long)(local_3b0 + 0x51) + -1];
                  }
                  for (local_3b0 = 0; local_3b0 < 9; local_3b0 = local_3b0 + 1) {
                    ab[(long)(local_3b0 + 0x51) + -1] =
                         r[cloud_global._4_4_ * local_3b0 + 2] * 0.0 +
                         ab[(long)(local_3b0 + 0x51) + -1];
                  }
                  a = (REF_DBL *)0x0;
                  for (local_3b0 = 0; local_3b0 < 9; local_3b0 = local_3b0 + 1) {
                    ab[(long)(local_3b0 + 0x51) + -1] =
                         r[cloud_global._4_4_ * local_3b0 + 3] * 0.0 +
                         ab[(long)(local_3b0 + 0x51) + -1];
                  }
                  local_3ac = 4;
                }
                i = 0;
                if (ref_cloud->n < 1) {
                  local_430 = -1;
                }
                else {
                  local_430 = *ref_cloud->global;
                }
                _im = local_430;
                while (i < ref_cloud->n) {
                  if (center_global != _im) {
                    a = (REF_DBL *)(ref_cloud->aux[ref_cloud->naux * i + 3] - xyzs[2]);
                    for (local_3b0 = 0; local_3b0 < 9; local_3b0 = local_3b0 + 1) {
                      ab[(long)(local_3b0 + 0x51) + -1] =
                           r[local_3ac + cloud_global._4_4_ * local_3b0] * (double)a +
                           ab[(long)(local_3b0 + 0x51) + -1];
                    }
                    local_3ac = local_3ac + 1;
                  }
                  i = i + 1;
                  if ((i < 0) || (ref_cloud->n <= i)) {
                    local_438 = -1;
                  }
                  else {
                    local_438 = ref_cloud->global[i];
                  }
                  _im = local_438;
                }
                if ((long)cloud_global._4_4_ == (long)local_3ac) {
                  center_global_local._4_4_ = ref_matrix_solve_ab(9,10,&dx);
                  if (center_global_local._4_4_ == 0) {
                    for (j = 0; j < 6; j = j + 1) {
                      hessian[j] = ab[(long)(j + 0x51) + -1];
                    }
                    for (j = 0; j < 3; j = j + 1) {
                      gradient[j] = ab[(long)(j + 0x57) + -1];
                    }
                    if (_n != (REF_DBL *)0x0) {
                      free(_n);
                    }
                    if (r != (REF_DBL *)0x0) {
                      free(r);
                    }
                    if (q != (REF_DBL *)0x0) {
                      free(q);
                    }
                    center_global_local._4_4_ = 0;
                  }
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x256,"ref_recon_kexact_with_aux","b row miscount",
                         (long)cloud_global._4_4_,(long)local_3ac);
                  center_global_local._4_4_ = 1;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x22f,"ref_recon_kexact_with_aux",(ulong)center_global_local._4_4_,
                       "kexact lsq hess qr");
              }
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x22e,"ref_recon_kexact_with_aux","A row miscount",(long)cloud_global._4_4_,
                     (long)local_3ac);
              center_global_local._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x1be,
           "ref_recon_kexact_with_aux",(ulong)center_global_local._4_4_,"missing center");
  }
  return center_global_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_recon_kexact_with_aux(REF_GLOB center_global,
                                                    REF_CLOUD ref_cloud,
                                                    REF_BOOL twod,
                                                    REF_DBL *gradient,
                                                    REF_DBL *hessian) {
  REF_DBL geom[9], ab[90];
  REF_DBL dx, dy, dz, dq;
  REF_DBL *a, *q, *r;
  REF_INT m, n;
  REF_GLOB cloud_global;
  REF_INT item, im, i, j;
  REF_DBL xyzs[4];
  REF_BOOL verbose = REF_FALSE;

  for (im = 0; im < 6; im++) {
    hessian[im] = 0.0;
  }
  for (im = 0; im < 3; im++) {
    gradient[im] = 0.0;
  }

  RSS(ref_cloud_item(ref_cloud, center_global, &item), "missing center");
  each_ref_cloud_aux(ref_cloud, i) {
    xyzs[i] = ref_cloud_aux(ref_cloud, i, item);
  }
  /* solve A with QR factorization size m x n */
  m = ref_cloud_n(ref_cloud) - 1; /* skip self */
  if (twod) m += 4;               /* add z node node */
  n = 9;
  if (verbose)
    printf("m %d at %f %f %f %f\n", m, xyzs[0], xyzs[1], xyzs[2], xyzs[3]);
  if (m < n) {           /* underdetermined, will end badly */
    return REF_DIV_ZERO; /* signal cloud growth required */
  }
  ref_malloc(a, m * n, REF_DBL);
  ref_malloc(q, m * n, REF_DBL);
  ref_malloc(r, n * n, REF_DBL);
  i = 0;
  if (twod) {
    dx = 0;
    dy = 0;
    dz = 1;
    geom[0] = 0.5 * dx * dx;
    geom[1] = dx * dy;
    geom[2] = dx * dz;
    geom[3] = 0.5 * dy * dy;
    geom[4] = dy * dz;
    geom[5] = 0.5 * dz * dz;
    geom[6] = dx;
    geom[7] = dy;
    geom[8] = dz;
    for (j = 0; j < n; j++) {
      a[i + m * j] = geom[j];
      if (verbose) printf(" %12.4e", geom[j]);
    }
    if (verbose) printf(" %f %f %f %d\n", dx, dy, dz, i);
    i++;
    dx = 0;
    dy = 0;
    dz = 2;
    geom[0] = 0.5 * dx * dx;
    geom[1] = dx * dy;
    geom[2] = dx * dz;
    geom[3] = 0.5 * dy * dy;
    geom[4] = dy * dz;
    geom[5] = 0.5 * dz * dz;
    geom[6] = dx;
    geom[7] = dy;
    geom[8] = dz;
    for (j = 0; j < n; j++) {
      a[i + m * j] = geom[j];
      if (verbose) printf(" %12.4e", geom[j]);
    }
    if (verbose) printf(" %f %f %f %d\n", dx, dy, dz, i);
    i++;
    dx = 1;
    dy = 0;
    dz = 1;
    geom[0] = 0.5 * dx * dx;
    geom[1] = dx * dy;
    geom[2] = dx * dz;
    geom[3] = 0.5 * dy * dy;
    geom[4] = dy * dz;
    geom[5] = 0.5 * dz * dz;
    geom[6] = dx;
    geom[7] = dy;
    geom[8] = dz;
    for (j = 0; j < n; j++) {
      a[i + m * j] = geom[j];
      if (verbose) printf(" %12.4e", geom[j]);
    }
    if (verbose) printf(" %f %f %f %d\n", dx, dy, dz, i);
    i++;
    dx = 0;
    dy = 1;
    dz = 1;
    geom[0] = 0.5 * dx * dx;
    geom[1] = dx * dy;
    geom[2] = dx * dz;
    geom[3] = 0.5 * dy * dy;
    geom[4] = dy * dz;
    geom[5] = 0.5 * dz * dz;
    geom[6] = dx;
    geom[7] = dy;
    geom[8] = dz;
    for (j = 0; j < n; j++) {
      a[i + m * j] = geom[j];
      if (verbose) printf(" %12.4e", geom[j]);
    }
    if (verbose) printf(" %f %f %f %d\n", dx, dy, dz, i);
    i++;
  }
  each_ref_cloud_global(ref_cloud, item, cloud_global) {
    if (center_global == cloud_global) continue; /* skip self */
    dx = ref_cloud_aux(ref_cloud, 0, item) - xyzs[0];
    dy = ref_cloud_aux(ref_cloud, 1, item) - xyzs[1];
    dz = ref_cloud_aux(ref_cloud, 2, item) - xyzs[2];
    geom[0] = 0.5 * dx * dx;
    geom[1] = dx * dy;
    geom[2] = dx * dz;
    geom[3] = 0.5 * dy * dy;
    geom[4] = dy * dz;
    geom[5] = 0.5 * dz * dz;
    geom[6] = dx;
    geom[7] = dy;
    geom[8] = dz;
    for (j = 0; j < n; j++) {
      a[i + m * j] = geom[j];
      if (verbose) printf(" %12.4e", geom[j]);
    }
    if (verbose) printf(" %f %f %f %d\n", dx, dy, dz, i);
    i++;
  }
  REIS(m, i, "A row miscount");
  RSS(ref_matrix_qr(m, n, a, q, r), "kexact lsq hess qr");
  if (verbose) RSS(ref_matrix_show_aqr(m, n, a, q, r), "show qr");
  for (i = 0; i < 90; i++) ab[i] = 0.0;
  for (i = 0; i < 9; i++) {
    for (j = 0; j < 9; j++) {
      ab[i + 9 * j] += r[i + 9 * j];
    }
  }
  i = 0;
  if (twod) {
    dq = 0;
    for (j = 0; j < 9; j++) {
      ab[j + 9 * 9] += q[i + m * j] * dq;
    }
    i++;
    dq = 0;
    for (j = 0; j < 9; j++) {
      ab[j + 9 * 9] += q[i + m * j] * dq;
    }
    i++;
    dq = 0;
    for (j = 0; j < 9; j++) {
      ab[j + 9 * 9] += q[i + m * j] * dq;
    }
    i++;
    dq = 0;
    for (j = 0; j < 9; j++) {
      ab[j + 9 * 9] += q[i + m * j] * dq;
    }
    i++;
  }
  each_ref_cloud_global(ref_cloud, item, cloud_global) {
    if (center_global == cloud_global) continue; /* skip self */
    dq = ref_cloud_aux(ref_cloud, 3, item) - xyzs[3];
    for (j = 0; j < 9; j++) {
      ab[j + 9 * 9] += q[i + m * j] * dq;
    }
    i++;
  }
  REIS(m, i, "b row miscount");
  if (verbose) RSS(ref_matrix_show_ab(9, 10, ab), "show");
  RAISE(ref_matrix_solve_ab(9, 10, ab));
  if (verbose) RSS(ref_matrix_show_ab(9, 10, ab), "show");
  j = 9;
  for (im = 0; im < 6; im++) {
    hessian[im] = ab[im + 9 * j];
  }
  for (im = 0; im < 3; im++) {
    gradient[im] = ab[im + 6 + 9 * j];
  }
  ref_free(r);
  ref_free(q);
  ref_free(a);

  return REF_SUCCESS;
}